

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O3

void __thiscall Liby::PollerEpoll::removeChanel(PollerEpoll *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  double __x;
  
  if (ch != (Channel *)0x0) {
    iVar1 = ch->fd_;
    if (-1 < (long)iVar1) {
      this_00 = Logger::getLogger();
      Logger::log(this_00,__x);
      (this->super_Poller).channels_.
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1] = (Channel *)0x0;
      this->eventsSize_ = this->eventsSize_ - 1;
      iVar1 = epoll_ctl(this->pollerfd_,2,iVar1,(epoll_event *)0x0);
      if (-1 < iVar1) {
        return;
      }
      piVar2 = __errno_location();
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = strerror(*piVar2);
      *puVar3 = pcVar4;
      __cxa_throw(puVar3,&char*::typeinfo,0);
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                ,0x71,"virtual void Liby::PollerEpoll::removeChanel(Channel *)");
}

Assistant:

void PollerEpoll::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    verbose("remove fd = %d, chan = %p\n", ch->get_fd(), ch);
    setChannel(fd, nullptr);
    eventsSize_--;

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_DEL, fd, nullptr);

    if (ret < 0) {
        int err = errno;
        ClearUnuseVariableWarning(err);
        throw ::strerror(errno);
    }
}